

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::StringOutputStream::Next(StringOutputStream *this,void **data,int *size)

{
  string *psVar1;
  ulong uVar2;
  pointer pcVar3;
  ulong uVar4;
  int iVar5;
  
  psVar1 = this->target_;
  iVar5 = (int)psVar1->_M_string_length;
  uVar2 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(psVar1->_M_dataplus)._M_p != &psVar1->field_2) {
    uVar2 = (psVar1->field_2)._M_allocated_capacity;
  }
  uVar4 = 0x10;
  if (0x10 < iVar5 * 2) {
    uVar4 = (ulong)(uint)(iVar5 * 2);
  }
  if ((ulong)(long)iVar5 < uVar2) {
    uVar4 = uVar2;
  }
  pcVar3 = (pointer)0x0;
  std::__cxx11::string::resize((ulong)psVar1,(char)uVar4);
  if (this->target_->_M_string_length != 0) {
    pcVar3 = (this->target_->_M_dataplus)._M_p;
  }
  *data = pcVar3 + iVar5;
  *size = (int)this->target_->_M_string_length - iVar5;
  return true;
}

Assistant:

bool StringOutputStream::Next(void** data, int* size) {
  int old_size = target_->size();

  // Grow the string.
  if (old_size < target_->capacity()) {
    // Resize the string to match its capacity, since we can get away
    // without a memory allocation this way.
    STLStringResizeUninitialized(target_, target_->capacity());
  } else {
    // Size has reached capacity, so double the size.  Also make sure
    // that the new size is at least kMinimumSize.
    STLStringResizeUninitialized(
      target_,
      max(old_size * 2,
          kMinimumSize + 0));  // "+ 0" works around GCC4 weirdness.
  }

  *data = string_as_array(target_) + old_size;
  *size = target_->size() - old_size;
  return true;
}